

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double empirical_discrete_cdf(double x,int a,double *b,double *c)

{
  double dVar1;
  int local_44;
  double dStack_40;
  int i;
  double cdf;
  double bsum;
  double *c_local;
  double *b_local;
  int a_local;
  double x_local;
  
  dStack_40 = 0.0;
  dVar1 = r8vec_sum(a,b);
  local_44 = 1;
  while ((local_44 <= a && (c[local_44 + -1] <= x))) {
    dStack_40 = dStack_40 + b[local_44 + -1] / dVar1;
    local_44 = local_44 + 1;
  }
  return dStack_40;
}

Assistant:

double empirical_discrete_cdf ( double x, int a, double b[], double c[] )

//****************************************************************************80
//
//  Purpose:
//
//    EMPIRICAL_DISCRETE_CDF evaluates the Empirical Discrete CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, int A, the number of values.
//    0 < A.
//
//    Input, double B[A], the weights of each value.
//    0 <= B(1:A) and at least one value is nonzero.
//
//    Input, double C[A], the values.
//    The values must be distinct and in ascending order.
//
//    Output, double EMPIRICAL_DISCRETE_CDF, the value of the CDF.
//
{
  double bsum;
  double cdf;
  int i;

  cdf = 0.0;

  bsum = r8vec_sum ( a, b );

  for ( i = 1; i <= a; i++ )
  {
    if ( x < c[i-1] )
    {
      return cdf;
    }
    cdf = cdf + b[i-1] / bsum;
  }

  return cdf;
}